

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCompression.cpp
# Opt level: O0

void anon_unknown.dwarf_219e0f::writeRead
               (string *tempDir,Array2D<unsigned_int> *pi,Array2D<Imath_3_2::half> *ph,
               Array2D<float> *pf,int w,int h,int xs,int ys,int dx,int dy)

{
  int comp;
  string filename;
  int in_stack_00000930;
  LineOrder in_stack_00000934;
  char *in_stack_00000938;
  Array2D<float> *in_stack_00000940;
  Array2D<Imath_3_2::half> *in_stack_00000948;
  Array2D<unsigned_int> *in_stack_00000950;
  int in_stack_00000960;
  int in_stack_00000968;
  int in_stack_00000970;
  int in_stack_00000978;
  int in_stack_00000980;
  Compression in_stack_00000988;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  int local_64;
  string local_60 [72];
  
  std::operator+(in_stack_ffffffffffffff68,
                 (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  for (local_64 = 0; local_64 < 10; local_64 = local_64 + 1) {
    std::__cxx11::string::c_str();
    writeRead(in_stack_00000950,in_stack_00000948,in_stack_00000940,in_stack_00000938,
              in_stack_00000934,in_stack_00000930,in_stack_00000960,in_stack_00000968,
              in_stack_00000970,in_stack_00000978,in_stack_00000980,in_stack_00000988);
  }
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

void
writeRead (
    const std::string&           tempDir,
    const Array2D<unsigned int>& pi,
    const Array2D<half>&         ph,
    const Array2D<float>&        pf,
    int                          w,
    int                          h,
    int                          xs,
    int                          ys,
    int                          dx,
    int                          dy)
{
    std::string filename = tempDir + "imf_test_comp.exr";

    for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
    {
        writeRead (
            pi,
            ph,
            pf,
            filename.c_str (),
            LineOrder (0),
            w,
            h,
            xs,
            ys,
            dx,
            dy,
            Compression (comp));
    }
}